

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O3

bool __thiscall
caffe::ImageDataParameter::MergePartialFromCodedStream
          (ImageDataParameter *this,CodedInputStream *input)

{
  byte bVar1;
  void *pvVar2;
  float *pfVar3;
  uint8 *puVar4;
  ArenaStringPtr *pAVar5;
  ArenaStringPtr *pAVar6;
  ArenaStringPtr *pAVar7;
  bool bVar8;
  uint32 uVar9;
  unsigned_long uVar10;
  byte *pbVar11;
  long lVar12;
  UnknownFieldSet *unknown_fields;
  string *psVar13;
  char cVar14;
  uint tag;
  ulong uVar15;
  float fVar16;
  pair<unsigned_long,_bool> pVar17;
  float local_4c;
  ArenaStringPtr *local_48;
  ArenaStringPtr *local_40;
  ArenaStringPtr *local_38;
  
  local_38 = &this->root_folder_;
  local_40 = &this->mean_file_;
  local_48 = &this->source_;
LAB_003af576:
  pbVar11 = input->buffer_;
  uVar9 = 0;
  if (pbVar11 < input->buffer_end_) {
    bVar1 = *pbVar11;
    uVar9 = (uint32)bVar1;
    if ((char)bVar1 < '\x01') goto LAB_003af59a;
    input->buffer_ = pbVar11 + 1;
    uVar15 = (ulong)bVar1 | 0x100000000;
  }
  else {
LAB_003af59a:
    uVar9 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar9);
    uVar15 = 0;
    if (uVar9 - 1 < 0x7f) {
      uVar15 = 0x100000000;
    }
    uVar15 = uVar9 | uVar15;
  }
  pAVar7 = local_38;
  pAVar6 = local_40;
  pAVar5 = local_48;
  tag = (uint)uVar15;
  if ((uVar15 & 0x100000000) == 0) goto switchD_003af610_default;
  cVar14 = (char)uVar15;
  switch((uint)(uVar15 >> 3) & 0x1fffffff) {
  case 1:
    if (cVar14 == '\n') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 1;
      psVar13 = (this->source_).ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_48,(string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = pAVar5->ptr_;
      }
      bVar8 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar8) {
        return false;
      }
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((local_48->ptr_->_M_dataplus)._M_p,(int)local_48->ptr_->_M_string_length,PARSE,
                 "caffe.ImageDataParameter.source");
      goto LAB_003af576;
    }
    break;
  case 2:
    if (cVar14 == '\x15') {
      pbVar11 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar11 = *pbVar11 | 4;
      pfVar3 = (float *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pfVar3 < 4) {
        bVar8 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_4c);
        fVar16 = local_4c;
        if (!bVar8) {
          return false;
        }
      }
      else {
        fVar16 = *pfVar3;
        input->buffer_ = (uint8 *)(pfVar3 + 1);
      }
      this->scale_ = fVar16;
      goto LAB_003af576;
    }
    break;
  case 3:
    if (cVar14 == '\x1a') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 2;
      psVar13 = (this->mean_file_).ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_40,(string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = pAVar6->ptr_;
      }
      bVar8 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar8) {
        return false;
      }
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((local_40->ptr_->_M_dataplus)._M_p,(int)local_40->ptr_->_M_string_length,PARSE,
                 "caffe.ImageDataParameter.mean_file");
      goto LAB_003af576;
    }
    break;
  case 4:
    if (cVar14 != ' ') break;
    pbVar11 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
    *pbVar11 = *pbVar11 | 8;
    pbVar11 = input->buffer_;
    if (pbVar11 < input->buffer_end_) {
      bVar1 = *pbVar11;
      uVar9 = (uint32)bVar1;
      if (-1 < (char)bVar1) {
        this->batch_size_ = (uint)bVar1;
LAB_003af8f5:
        input->buffer_ = pbVar11 + 1;
        goto LAB_003af576;
      }
    }
    else {
      uVar9 = 0;
    }
    lVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
    this->batch_size_ = (uint32)lVar12;
LAB_003af9d4:
    if (lVar12 < 0) {
      return false;
    }
    goto LAB_003af576;
  case 5:
    if (cVar14 == '(') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 8;
      pbVar11 = input->buffer_;
      if (pbVar11 < input->buffer_end_) {
        bVar1 = *pbVar11;
        uVar9 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->crop_size_ = (uint)bVar1;
          goto LAB_003af8f5;
        }
      }
      else {
        uVar9 = 0;
      }
      lVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      this->crop_size_ = (uint32)lVar12;
      goto LAB_003af9d4;
    }
    break;
  case 6:
    if (cVar14 == '0') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x40;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) &&
         (uVar10 = (unsigned_long)(char)*puVar4, -1 < (long)uVar10)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar17 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar10 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->mirror_ = uVar10 != 0;
      goto LAB_003af576;
    }
    break;
  case 7:
    if (cVar14 == '8') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x10;
      pbVar11 = input->buffer_;
      if (pbVar11 < input->buffer_end_) {
        bVar1 = *pbVar11;
        uVar9 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->rand_skip_ = (uint)bVar1;
          goto LAB_003af8f5;
        }
      }
      else {
        uVar9 = 0;
      }
      lVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      this->rand_skip_ = (uint32)lVar12;
      goto LAB_003af9d4;
    }
    break;
  case 8:
    if (cVar14 == '@') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x20;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) &&
         (uVar10 = (unsigned_long)(char)*puVar4, -1 < (long)uVar10)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar17 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar10 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->shuffle_ = uVar10 != 0;
      goto LAB_003af576;
    }
    break;
  case 9:
    if (cVar14 == 'H') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 0x80;
      pbVar11 = input->buffer_;
      if (pbVar11 < input->buffer_end_) {
        bVar1 = *pbVar11;
        uVar9 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->new_height_ = (uint)bVar1;
          goto LAB_003af8f5;
        }
      }
      else {
        uVar9 = 0;
      }
      lVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      this->new_height_ = (uint32)lVar12;
      goto LAB_003af9d4;
    }
    break;
  case 10:
    if (cVar14 == 'P') {
      pbVar11 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar11 = *pbVar11 | 1;
      pbVar11 = input->buffer_;
      if (pbVar11 < input->buffer_end_) {
        bVar1 = *pbVar11;
        uVar9 = (uint32)bVar1;
        if (-1 < (char)bVar1) {
          this->new_width_ = (uint)bVar1;
          goto LAB_003af8f5;
        }
      }
      else {
        uVar9 = 0;
      }
      lVar12 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar9);
      this->new_width_ = (uint32)lVar12;
      goto LAB_003af9d4;
    }
    break;
  case 0xb:
    if (cVar14 == 'X') {
      pbVar11 = (byte *)((long)(this->_has_bits_).has_bits_ + 1);
      *pbVar11 = *pbVar11 | 2;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) &&
         (uVar10 = (unsigned_long)(char)*puVar4, -1 < (long)uVar10)) {
        input->buffer_ = puVar4 + 1;
      }
      else {
        pVar17 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        uVar10 = pVar17.first;
        if (((undefined1  [16])pVar17 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
          return false;
        }
      }
      this->is_color_ = uVar10 != 0;
      goto LAB_003af576;
    }
    break;
  case 0xc:
    if (cVar14 == 'b') {
      *(byte *)(this->_has_bits_).has_bits_ = (byte)(this->_has_bits_).has_bits_[0] | 4;
      psVar13 = (this->root_folder_).ptr_;
      if (psVar13 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
        google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                  (local_38,(string *)
                            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        psVar13 = pAVar7->ptr_;
      }
      bVar8 = google::protobuf::internal::WireFormatLite::ReadBytes(input,psVar13);
      if (!bVar8) {
        return false;
      }
      google::protobuf::internal::WireFormatLite::VerifyUtf8String
                ((local_38->ptr_->_M_dataplus)._M_p,(int)local_38->ptr_->_M_string_length,PARSE,
                 "caffe.ImageDataParameter.root_folder");
      goto LAB_003af576;
    }
  }
switchD_003af610_default:
  if (tag == 0) {
    return true;
  }
  if ((tag & 7) == 4) {
    return true;
  }
  pvVar2 = (this->_internal_metadata_).
           super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
           .ptr_;
  if (((ulong)pvVar2 & 1) == 0) {
    unknown_fields =
         google::protobuf::internal::
         InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
         ::mutable_unknown_fields_slow
                   (&(this->_internal_metadata_).
                     super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
                   );
  }
  else {
    unknown_fields = (UnknownFieldSet *)((ulong)pvVar2 & 0xfffffffffffffffe);
  }
  bVar8 = google::protobuf::internal::WireFormat::SkipField(input,tag,unknown_fields);
  if (!bVar8) {
    return false;
  }
  goto LAB_003af576;
}

Assistant:

bool ImageDataParameter::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:caffe.ImageDataParameter)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // optional string source = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_source()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->source().data(), this->source().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ImageDataParameter.source");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional float scale = 2 [default = 1];
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {
          set_has_scale();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scale_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string mean_file = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_mean_file()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->mean_file().data(), this->mean_file().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ImageDataParameter.mean_file");
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 batch_size = 4 [default = 1];
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          set_has_batch_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &batch_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 crop_size = 5 [default = 0];
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(40u)) {
          set_has_crop_size();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &crop_size_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool mirror = 6 [default = false];
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(48u)) {
          set_has_mirror();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &mirror_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 rand_skip = 7 [default = 0];
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(56u)) {
          set_has_rand_skip();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &rand_skip_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool shuffle = 8 [default = false];
      case 8: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(64u)) {
          set_has_shuffle();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &shuffle_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 new_height = 9 [default = 0];
      case 9: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(72u)) {
          set_has_new_height();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &new_height_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional uint32 new_width = 10 [default = 0];
      case 10: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(80u)) {
          set_has_new_width();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint32, ::google::protobuf::internal::WireFormatLite::TYPE_UINT32>(
                 input, &new_width_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional bool is_color = 11 [default = true];
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(88u)) {
          set_has_is_color();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &is_color_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // optional string root_folder = 12 [default = ""];
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(98u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_root_folder()));
          ::google::protobuf::internal::WireFormat::VerifyUTF8StringNamedField(
            this->root_folder().data(), this->root_folder().length(),
            ::google::protobuf::internal::WireFormat::PARSE,
            "caffe.ImageDataParameter.root_folder");
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormat::SkipField(
              input, tag, mutable_unknown_fields()));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:caffe.ImageDataParameter)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:caffe.ImageDataParameter)
  return false;
#undef DO_
}